

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  stbi_uc sVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int depth;
  int iVar14;
  byte *pbVar15;
  stbi_uc *psVar16;
  byte *pbVar17;
  undefined8 *puVar18;
  stbi_uc *psVar19;
  uint uVar20;
  char *pcVar21;
  int *piVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  stbi_uc *psVar26;
  byte bVar27;
  uint uVar28;
  stbi__uint16 *tc_00;
  ulong uVar29;
  stbi__png *z_00;
  size_t sVar30;
  long lVar31;
  int out_n;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  ulong local_4e0;
  stbi_uc tc [3];
  size_t local_4c0;
  ulong local_4b8;
  stbi__uint32 local_490;
  stbi__uint32 raw_len;
  ulong local_460;
  stbi_uc *local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar5 = true;
  bVar7 = 0;
  uVar12 = 0;
  bVar3 = false;
  uVar20 = 0;
  local_4c0 = 0;
  local_4e0 = 0;
  bVar4 = false;
  bVar27 = 0;
LAB_0012f812:
  iVar8 = stbi__get16be(s);
  uVar9 = stbi__get16be(s);
  uVar32 = iVar8 * 0x10000 + uVar9;
  uVar10 = stbi__get16be(s);
  uVar11 = stbi__get16be(s);
  uVar24 = uVar10 << 0x10 | uVar11;
  uVar25 = (uint)local_4e0;
  if ((int)uVar24 < 0x49484452) {
    if (uVar24 == 0x43674249) {
      bVar3 = true;
LAB_0012fc59:
      stbi__skip(s,uVar32);
      goto LAB_0012fc6b;
    }
    if (uVar24 != 0x49444154) {
      if (uVar24 != 0x49454e44) goto LAB_0012fc3f;
      if (bVar5) goto LAB_0012feeb;
      if (scan != 0) {
        return 1;
      }
      if (*ppsVar1 == (stbi_uc *)0x0) {
        puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        pcVar21 = "no IDAT";
        goto LAB_0012fefe;
      }
      raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
      psVar16 = (stbi_uc *)
                stbi_zlib_decode_malloc_guesssize_headerflag
                          ((char *)*ppsVar1,uVar25,raw_len,(int *)&raw_len,(uint)!bVar3);
      z->expanded = psVar16;
      if (psVar16 == (stbi_uc *)0x0) {
        return 0;
      }
      free(z->idata);
      z->idata = (stbi_uc *)0x0;
      iVar8 = s->img_n + 1;
      iVar13 = s->img_n;
      if (bVar4) {
        iVar13 = iVar8;
      }
      out_n = iVar13;
      if (req_comp != 3) {
        out_n = iVar8;
      }
      if (bVar27 != 0) {
        out_n = iVar13;
      }
      if (iVar8 != req_comp) {
        out_n = iVar13;
      }
      s->img_out_n = out_n;
      uVar20 = z->depth;
      local_460 = (ulong)uVar20;
      iVar8 = out_n << (uVar20 == 0x10);
      x = z->s->img_x;
      y = z->s->img_y;
      if (bVar7 == 0) {
        iVar8 = stbi__create_png_image_raw(z,z->expanded,raw_len,out_n,x,y,uVar20,uVar12);
        if (iVar8 == 0) {
          return 0;
        }
      }
      else {
        local_490 = raw_len;
        local_458 = z->expanded;
        psVar16 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar8,0);
        if (psVar16 == (stbi_uc *)0x0) goto LAB_00130588;
        sVar30 = (size_t)iVar8;
        lVar31 = 0;
        do {
          psVar2 = z->s;
          uVar20 = (&DAT_00150900)[lVar31];
          uVar25 = (&DAT_00150940)[lVar31];
          uVar28 = ~uVar20 + psVar2->img_x + uVar25;
          uVar11 = uVar28 / uVar25;
          uVar9 = (&DAT_00150920)[lVar31];
          uVar10 = (&DAT_00150960)[lVar31];
          uVar32 = ~uVar9 + psVar2->img_y + uVar10;
          uVar24 = uVar32 / uVar10;
          if ((uVar25 <= uVar28) && (uVar10 <= uVar32)) {
            depth = (int)local_460;
            iVar13 = psVar2->img_n;
            iVar14 = stbi__create_png_image_raw
                               (z,local_458,local_490,out_n,uVar11,uVar24,depth,uVar12);
            if (iVar14 == 0) {
              free(psVar16);
              return 0;
            }
            if (0 < (int)uVar24) {
              iVar14 = uVar9 * iVar8;
              local_4b8 = 0;
              do {
                if (0 < (int)uVar11) {
                  psVar19 = z->out;
                  psVar26 = psVar16 + (ulong)(z->s->img_x * iVar14) + (long)(int)uVar20 * sVar30;
                  lVar33 = 0;
                  do {
                    memcpy(psVar26,psVar19 + (local_4b8 * (long)(int)uVar11 + lVar33) * sVar30,
                           sVar30);
                    lVar33 = lVar33 + 1;
                    psVar26 = psVar26 + (long)(int)uVar25 * sVar30;
                  } while (lVar33 < (int)uVar11);
                }
                local_4b8 = local_4b8 + 1;
                iVar14 = iVar14 + uVar10 * iVar8;
              } while (local_4b8 < uVar24);
            }
            uVar24 = (((int)(uVar11 * depth * iVar13 + 7) >> 3) + 1) * uVar24;
            free(z->out);
            local_458 = local_458 + uVar24;
            local_490 = local_490 - uVar24;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 7);
        z->out = psVar16;
      }
      if (bVar4) {
        z_00 = (stbi__png *)(ulong)z->s->img_x;
        tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
        iVar8 = (int)z->out;
        if (z->depth == 0x10) {
          stbi__compute_transparency16(z_00,tc_00,iVar8);
        }
        else {
          stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar8);
        }
      }
      if (bVar3) {
        lVar31 = __tls_get_addr(&PTR_00160d40);
        piVar22 = &stbi__de_iphone_flag_global;
        if (*(int *)(lVar31 + 0x1c) != 0) {
          piVar22 = (int *)(lVar31 + 0x18);
        }
        if ((*piVar22 != 0) && (2 < s->img_out_n)) {
          stbi__de_iphone((stbi__png *)z->s);
        }
      }
      if (bVar27 == 0) {
        if (bVar4) {
          s->img_n = s->img_n + 1;
        }
      }
      else {
        s->img_n = (uint)bVar27;
        uVar20 = (uint)bVar27;
        if (2 < req_comp) {
          uVar20 = req_comp;
        }
        s->img_out_n = uVar20;
        psVar16 = z->out;
        uVar12 = z->s->img_y * z->s->img_x;
        psVar19 = (stbi_uc *)stbi__malloc_mad2(uVar12,uVar20,0);
        if (psVar19 == (stbi_uc *)0x0) {
LAB_00130588:
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          *puVar18 = "outofmem";
          return 0;
        }
        if (uVar20 == 3) {
          if (uVar12 != 0) {
            uVar34 = 0;
            psVar26 = psVar19;
            do {
              uVar29 = (ulong)psVar16[uVar34];
              *psVar26 = palette[uVar29 * 4];
              psVar26[1] = palette[uVar29 * 4 + 1];
              psVar26[2] = palette[uVar29 * 4 + 2];
              psVar26 = psVar26 + 3;
              uVar34 = uVar34 + 1;
            } while (uVar12 != uVar34);
          }
        }
        else if (uVar12 != 0) {
          uVar34 = 0;
          do {
            *(undefined4 *)(psVar19 + uVar34 * 4) =
                 *(undefined4 *)(palette + (ulong)psVar16[uVar34] * 4);
            uVar34 = uVar34 + 1;
          } while (uVar12 != uVar34);
        }
        free(psVar16);
        z->out = psVar19;
      }
      free(z->expanded);
      z->expanded = (stbi_uc *)0x0;
      stbi__get16be(s);
      stbi__get16be(s);
      return 1;
    }
    if (!bVar5) {
      if ((bVar27 == 0) || (uVar20 != 0)) {
        if (scan == 2) {
          if (bVar27 != 0) {
            s->img_n = (uint)bVar27;
            return 1;
          }
          return 1;
        }
        if (uVar32 < 0x40000001) {
          uVar9 = uVar32 + uVar25;
          if ((int)uVar9 < (int)uVar25) {
            return 0;
          }
          if ((uint)local_4c0 < uVar9) {
            sVar30 = 0x1000;
            if (0x1000 < uVar32) {
              sVar30 = (ulong)uVar32;
            }
            if ((uint)local_4c0 != 0) {
              sVar30 = local_4c0;
            }
            do {
              local_4c0 = sVar30;
              sVar30 = (ulong)((uint)local_4c0 * 2);
            } while ((uint)local_4c0 < uVar9);
            psVar16 = (stbi_uc *)realloc(*ppsVar1,local_4c0);
            if (psVar16 == (stbi_uc *)0x0) goto LAB_00130588;
            *ppsVar1 = psVar16;
          }
          else {
            psVar16 = *ppsVar1;
          }
          iVar8 = stbi__getn(s,psVar16 + local_4e0,uVar32);
          bVar5 = false;
          uVar25 = uVar9;
          if (iVar8 != 0) goto LAB_0012fc6b;
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "outofdata";
        }
        else {
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "IDAT size limit";
        }
      }
      else {
        puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        pcVar21 = "no PLTE";
      }
      goto LAB_0012fefe;
    }
  }
  else {
    if (uVar24 == 0x74524e53) {
      if (bVar5) goto LAB_0012feeb;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        pcVar21 = "tRNS after IDAT";
        goto LAB_0012fefe;
      }
      if (bVar27 == 0) {
        uVar9 = s->img_n;
        if ((uVar9 & 1) == 0) {
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "tRNS with alpha";
          goto LAB_0012fefe;
        }
        if (uVar9 * 2 != uVar32) {
LAB_0012ffe3:
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "bad tRNS len";
          goto LAB_0012fefe;
        }
        if (scan == 2) {
          s->img_n = uVar9 + 1;
          return 1;
        }
        if (z->depth == 0x10) {
          if (0 < (int)uVar9) {
            uVar34 = 0;
            do {
              iVar8 = stbi__get16be(s);
              tc16[uVar34] = (stbi__uint16)iVar8;
              if (1 < uVar34) break;
              uVar34 = uVar34 + 1;
            } while ((long)uVar34 < (long)s->img_n);
          }
        }
        else if (0 < (int)uVar9) {
          uVar34 = 0;
          do {
            iVar8 = stbi__get16be(s);
            tc[uVar34] = ""[z->depth] * (char)iVar8;
            if (1 < uVar34) break;
            uVar34 = uVar34 + 1;
          } while ((long)uVar34 < (long)s->img_n);
        }
        bVar4 = true;
        bVar5 = false;
        bVar27 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar20 == 0) {
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "tRNS before PLTE";
          goto LAB_0012fefe;
        }
        if (uVar20 < uVar32) goto LAB_0012ffe3;
        bVar27 = 4;
        if (uVar32 == 0) {
          bVar5 = false;
        }
        else {
          bVar5 = false;
          psVar16 = s->img_buffer;
          uVar34 = 0;
          do {
            if (psVar16 < s->img_buffer_end) {
LAB_0012fad7:
              s->img_buffer = psVar16 + 1;
              sVar6 = *psVar16;
              psVar16 = psVar16 + 1;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar16 = s->img_buffer;
                goto LAB_0012fad7;
              }
              sVar6 = '\0';
            }
            palette[uVar34 * 4 + 3] = sVar6;
            uVar34 = uVar34 + 1;
          } while (uVar9 + iVar8 * 0x10000 != uVar34);
        }
      }
LAB_0012fc6b:
      stbi__get16be(s);
      stbi__get16be(s);
      local_4e0 = (ulong)uVar25;
      goto LAB_0012f812;
    }
    if (uVar24 == 0x504c5445) {
      if (!bVar5) {
        if ((uVar32 < 0x301) && (uVar20 = uVar9 * 0xaaab >> 0x11, uVar20 * 3 == uVar32)) {
          bVar5 = false;
          if (2 < uVar9) {
            psVar16 = s->img_buffer;
            uVar34 = 0;
            do {
              psVar19 = s->img_buffer_end;
              if (psVar16 < psVar19) {
LAB_0012fb7a:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  psVar19 = s->img_buffer_end;
                  goto LAB_0012fb7a;
                }
                sVar6 = '\0';
              }
              palette[uVar34 * 4] = sVar6;
              if (psVar16 < psVar19) {
LAB_0012fbb4:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  psVar19 = s->img_buffer_end;
                  goto LAB_0012fbb4;
                }
                sVar6 = '\0';
              }
              palette[uVar34 * 4 + 1] = sVar6;
              if (psVar16 < psVar19) {
LAB_0012fbe7:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  goto LAB_0012fbe7;
                }
                sVar6 = '\0';
              }
              palette[uVar34 * 4 + 2] = sVar6;
              palette[uVar34 * 4 + 3] = 0xff;
              uVar34 = uVar34 + 1;
            } while (uVar20 != uVar34);
          }
          goto LAB_0012fc6b;
        }
        puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        pcVar21 = "invalid PLTE";
        goto LAB_0012fefe;
      }
    }
    else {
      if (uVar24 == 0x49484452) {
        if (!bVar5) {
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "multiple IHDR";
          goto LAB_0012fefe;
        }
        if (uVar32 != 0xd) {
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "bad IHDR len";
          goto LAB_0012fefe;
        }
        iVar8 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        s->img_x = uVar12 | iVar8 << 0x10;
        iVar8 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar12 = uVar12 | iVar8 << 0x10;
        s->img_y = uVar12;
        if ((uVar12 < 0x1000001) && (s->img_x < 0x1000001)) {
          pbVar15 = s->img_buffer;
          if (pbVar15 < s->img_buffer_end) {
LAB_0012f90f:
            pbVar17 = pbVar15 + 1;
            s->img_buffer = pbVar17;
            bVar7 = *pbVar15;
            z->depth = (uint)bVar7;
            if ((bVar7 < 0x11) && ((0x10116U >> (bVar7 & 0x1f) & 1) != 0)) {
              if (s->img_buffer_end <= pbVar17) {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar17 = s->img_buffer;
                  goto LAB_0012f95b;
                }
                bVar23 = 0;
                uVar12 = 0;
                goto LAB_0012fd4a;
              }
LAB_0012f95b:
              pbVar15 = pbVar17 + 1;
              s->img_buffer = pbVar15;
              bVar23 = *pbVar17;
              uVar12 = (uint)bVar23;
              if (6 < uVar12) {
LAB_0012fec9:
                puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
                pcVar21 = "bad ctype";
                goto LAB_0012fefe;
              }
              pbVar17 = pbVar15;
              if (bVar23 == 3) {
                if (z->depth == 0x10) goto LAB_0012fec9;
                uVar12 = 3;
                bVar23 = 3;
                bVar27 = 3;
              }
              else if ((bVar23 & 1) != 0) goto LAB_0012fec9;
LAB_0012fd4a:
              if (pbVar17 < s->img_buffer_end) {
LAB_0012fd69:
                s->img_buffer = pbVar17 + 1;
                if (*pbVar17 != 0) {
                  puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
                  pcVar21 = "bad comp method";
                  goto LAB_0012fefe;
                }
              }
              else if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar17 = s->img_buffer;
                goto LAB_0012fd69;
              }
              sVar6 = stbi__get8(s);
              if (sVar6 != '\0') {
                puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
                pcVar21 = "bad filter method";
                goto LAB_0012fefe;
              }
              bVar7 = stbi__get8(s);
              if (1 < bVar7) {
                puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
                pcVar21 = "bad interlace method";
                goto LAB_0012fefe;
              }
              uVar9 = s->img_x;
              if ((uVar9 == 0) || (s->img_y == 0)) {
                puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
                pcVar21 = "0-pixel image";
                goto LAB_0012fefe;
              }
              if (bVar27 == 0) {
                uVar10 = (3 < bVar23) + 1 + (uVar12 & 2);
                s->img_n = uVar10;
                uVar9 = (uint)((0x40000000 / (ulong)uVar9) / (ulong)uVar10);
                bVar27 = 0;
              }
              else {
                s->img_n = 1;
                uVar9 = (uint)(0x40000000 / (ulong)uVar9 >> 2);
              }
              bVar5 = false;
              if (s->img_y <= uVar9) goto LAB_0012fc6b;
              goto LAB_0012fe8a;
            }
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar15 = s->img_buffer;
              goto LAB_0012f90f;
            }
            z->depth = 0;
          }
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar21 = "1/2/4/8/16-bit only";
          goto LAB_0012fefe;
        }
LAB_0012fe8a:
        puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        pcVar21 = "too large";
LAB_0012fefe:
        *puVar18 = pcVar21;
        return 0;
      }
LAB_0012fc3f:
      if (!bVar5) {
        bVar5 = false;
        if ((uVar10 >> 0xd & 1) == 0) {
          stbi__parse_png_file::invalid_chunk[0] = (char)(uVar10 >> 8);
          stbi__parse_png_file::invalid_chunk[1] = (char)uVar10;
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar11 >> 8);
          stbi__parse_png_file::invalid_chunk[3] = (char)uVar11;
          puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          *puVar18 = stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_0012fc59;
      }
    }
  }
LAB_0012feeb:
  puVar18 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
  pcVar21 = "first not IHDR";
  goto LAB_0012fefe;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n && k < 3; ++k) // extra loop test to suppress false GCC warning
                     tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n && k < 3; ++k)
                     tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}